

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

size_t __thiscall leveldb::anon_unknown_0::ShardedLRUCache::TotalCharge(ShardedLRUCache *this)

{
  pthread_mutex_t *__mutex;
  long lVar1;
  long lVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = 0;
  for (lVar2 = 0; lVar2 != 0xd80; lVar2 = lVar2 + 0xd8) {
    __mutex = (pthread_mutex_t *)(this->shard_[0].lru_.key_data + lVar2 + -0x74);
    std::mutex::lock((mutex *)&__mutex->__data);
    sVar3 = sVar3 + *(long *)(this->shard_[0].lru_.key_data + lVar2 + -0x4c);
    pthread_mutex_unlock(__mutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return sVar3;
  }
  __stack_chk_fail();
}

Assistant:

size_t TotalCharge() const override {
    size_t total = 0;
    for (int s = 0; s < kNumShards; s++) {
      total += shard_[s].TotalCharge();
    }
    return total;
  }